

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O3

IConnection * __thiscall tonk::P2PConnectionKeyMap::FindByKey(P2PConnectionKeyMap *this,key_t key)

{
  atomic<int> *paVar1;
  raw_node *prVar2;
  int iVar3;
  uint uVar4;
  raw_node *prVar5;
  uint uVar6;
  uint uVar7;
  IConnection *pIVar8;
  bool bVar9;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->P2PKeyLock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if ((this->P2PKeyMap).TheMap.m_num_valid != 0) {
    uVar4 = key * -0x61c88647 >> ((byte)(this->P2PKeyMap).TheMap.m_hash_shift & 0x1f);
    prVar2 = (this->P2PKeyMap).TheMap.m_values;
    if (prVar2[uVar4].m_bits[0x10] != '\0') {
      prVar5 = prVar2 + uVar4;
      uVar6 = uVar4;
      if (*(key_t *)prVar5->m_bits != key) {
        uVar7 = (this->P2PKeyMap).TheMap.m_values_count - 1;
        do {
          bVar9 = uVar6 == 0;
          prVar5 = prVar5 + -1;
          uVar6 = uVar6 - 1;
          if (bVar9) {
            prVar5 = prVar2 + uVar7;
            uVar6 = uVar7;
          }
          pIVar8 = (IConnection *)0x0;
          if ((uVar6 == uVar4) || (pIVar8 = (IConnection *)0x0, prVar5->m_bits[0x10] == '\0'))
          goto LAB_00150bf7;
        } while (*(key_t *)prVar5->m_bits != key);
      }
      if ((-1 < (int)uVar6) &&
         (pIVar8 = *(IConnection **)(prVar2[uVar6].m_bits + 8), pIVar8 != (IConnection *)0x0)) {
        LOCK();
        paVar1 = &(pIVar8->SelfRefCount).RefCount;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        goto LAB_00150bf7;
      }
    }
  }
  pIVar8 = (IConnection *)0x0;
LAB_00150bf7:
  pthread_mutex_unlock((pthread_mutex_t *)&this->P2PKeyLock);
  return pIVar8;
}

Assistant:

IConnection* FindByKey(key_t key)
    {
        Locker locker(P2PKeyLock);
        IConnection* connection = P2PKeyMap.Find(key);
        if (connection) {
            connection->SelfRefCount.IncrementReferences();
        }
        return connection;
    }